

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O0

void __thiscall
QSortFilterProxyModelPrivate::_q_sourceRowsAboutToBeInserted
          (QSortFilterProxyModelPrivate *this,QModelIndex *source_parent,int start,int end)

{
  bool bVar1;
  byte bVar2;
  parameter_type pVar3;
  undefined4 in_ECX;
  undefined4 in_EDX;
  QSortFilterProxyModelPrivate *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  bool recursive_accepted;
  bool toplevel;
  QModelIndex grandParent;
  QModelIndex parent;
  QModelIndex top_source_parent;
  byte local_c5;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffff50 [16];
  QModelIndex *in_stack_ffffffffffffff80;
  QSortFilterProxyModelPrivate *in_stack_ffffffffffffff88;
  QObject *local_70;
  QModelIndex *local_68;
  QSortFilterProxyModelPrivate *local_60;
  QObject *local_58;
  QModelIndex *local_50;
  QSortFilterProxyModelPrivate *local_48;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_40;
  QModelIndex *local_38;
  QSortFilterProxyModelPrivate *local_30;
  QObject *local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QModelIndex::isValid(in_RDI);
  bVar2 = (bVar1 ^ 0xffU) & 1;
  pVar3 = ::QObjectCompatProperty::operator_cast_to_bool
                    ((QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
                      *)0x87430b);
  uVar4 = false;
  if ((pVar3) && (uVar4 = false, bVar2 == 0)) {
    QModelIndex::row((QModelIndex *)in_RSI);
    QModelIndex::parent(in_stack_ffffffffffffff50._0_8_);
    uVar4 = filterAcceptsRowInternal
                      (in_stack_ffffffffffffff50._8_8_,in_stack_ffffffffffffff50._4_4_,
                       (QModelIndex *)CONCAT17(uVar4,in_stack_ffffffffffffff48));
  }
  uVar5 = uVar4;
  pVar3 = ::QObjectCompatProperty::operator_cast_to_bool
                    ((QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
                      *)0x87437c);
  if (((pVar3) && (bVar2 == 0)) && ((bool)uVar4 == false)) {
    local_38 = (QModelIndex *)
               (in_RSI->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
               super_QObjectPrivate.super_QObjectData._vptr_QObjectData;
    local_30 = (QSortFilterProxyModelPrivate *)
               (in_RSI->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
               super_QObjectPrivate.super_QObjectData.q_ptr;
    local_28 = (in_RSI->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
               super_QObjectPrivate.super_QObjectData.parent;
    local_50 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = (QSortFilterProxyModelPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_40.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::parent(in_stack_ffffffffffffff50._0_8_);
    local_68 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_60 = (QSortFilterProxyModelPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::parent(in_stack_ffffffffffffff50._0_8_);
    while( true ) {
      bVar1 = QModelIndex::isValid(in_RDI);
      local_c5 = 0;
      if (bVar1) {
        QModelIndex::row((QModelIndex *)&local_50);
        bVar1 = filterAcceptsRowInternal
                          (in_stack_ffffffffffffff50._8_8_,in_stack_ffffffffffffff50._4_4_,
                           (QModelIndex *)CONCAT17(uVar5,in_stack_ffffffffffffff48));
        local_c5 = bVar1 ^ 0xff;
      }
      if ((local_c5 & 1) == 0) break;
      local_38 = local_50;
      local_30 = local_48;
      local_28 = &(local_40.ptr)->super_QObject;
      local_50 = local_68;
      local_48 = local_60;
      local_40.ptr = (QAbstractItemModel *)local_58;
      QModelIndex::parent(in_stack_ffffffffffffff50._0_8_);
      local_58 = local_70;
      local_68 = in_stack_ffffffffffffff80;
      local_60 = in_stack_ffffffffffffff88;
    }
    *(QModelIndex **)(in_RDI + 0xc) = local_38;
    in_RDI[0xc].i = (quintptr)local_30;
    in_RDI[0xc].m.ptr = (QAbstractItemModel *)local_28;
  }
  else {
    bVar1 = can_create_mapping(in_RSI,(QModelIndex *)CONCAT44(in_EDX,in_ECX));
    if (bVar1) {
      create_mapping(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
    pVar3 = ::QObjectCompatProperty::operator_cast_to_bool
                      ((QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>
                        *)0x8743cf);
    if (pVar3) {
      *(undefined1 *)((long)&in_RDI[10].i + 4) = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSortFilterProxyModelPrivate::_q_sourceRowsAboutToBeInserted(
    const QModelIndex &source_parent, int start, int end)
{
    Q_UNUSED(start);
    Q_UNUSED(end);

    const bool toplevel = !source_parent.isValid();
    const bool recursive_accepted = filter_recursive && !toplevel && filterAcceptsRowInternal(source_parent.row(), source_parent.parent());
    //Force the creation of a mapping now, even if it's empty.
    //We need it because the proxy can be accessed at the moment it emits rowsAboutToBeInserted in insert_source_items
    if (!filter_recursive || toplevel || recursive_accepted) {
        if (can_create_mapping(source_parent))
            create_mapping(source_parent);
        if (filter_recursive)
            complete_insert = true;
    } else {
        // The row could have been rejected or the parent might be not yet known... let's try to discover it
        QModelIndex top_source_parent = source_parent;
        QModelIndex parent = source_parent.parent();
        QModelIndex grandParent = parent.parent();

        while (parent.isValid() && !filterAcceptsRowInternal(parent.row(), grandParent)) {
            top_source_parent = parent;
            parent = grandParent;
            grandParent = parent.parent();
        }

        last_top_source = top_source_parent;
    }
}